

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmBcc<(moira::Instr)18,(moira::Mode)12,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  int iVar3;
  long lVar4;
  StrWriter *pSVar5;
  char cVar6;
  char *pcVar7;
  
  uVar1 = *addr;
  SVar2 = str->style->syntax;
  if (SVar2 - GNU < 2) {
    cVar6 = 'b';
    lVar4 = 1;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = cVar6;
      cVar6 = "fdble"[lVar4 + 2];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    pSVar5 = StrWriter::operator<<(str);
    if ((pSVar5->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar7 = pSVar5->ptr;
      pSVar5->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
      str = pSVar5;
    }
    else {
      iVar3 = (str->tab).raw;
      pcVar7 = pSVar5->ptr;
      do {
        pSVar5->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
        pcVar7 = pSVar5->ptr;
        str = pSVar5;
      } while (pcVar7 < pSVar5->base + iVar3);
    }
  }
  else {
    if (SVar2 == MUSASHI) {
      if ((char)op == -1) {
        dasmIllegal<(moira::Instr)18,(moira::Mode)12,1>(this,str,addr,op);
        return;
      }
      cVar6 = 'b';
      lVar4 = 1;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = cVar6;
        cVar6 = "fdble"[lVar4 + 2];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        iVar3 = (str->tab).raw;
        pcVar7 = str->ptr;
        do {
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
          pcVar7 = str->ptr;
        } while (pcVar7 < str->base + iVar3);
        goto LAB_001eee00;
      }
    }
    else {
      cVar6 = 'b';
      lVar4 = 1;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = cVar6;
        cVar6 = "fdble"[lVar4 + 2];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        iVar3 = (str->tab).raw;
        pcVar7 = str->ptr;
        do {
          str->ptr = pcVar7 + 1;
          *pcVar7 = ' ';
          pcVar7 = str->ptr;
        } while (pcVar7 < str->base + iVar3);
        goto LAB_001eee00;
      }
    }
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ' ';
  }
LAB_001eee00:
  StrWriter::operator<<(str,(UInt)((char)op + 2 + uVar1));
  return;
}

Assistant:

void
Moira::dasmBcc(StrWriter &str, u32 &addr, u16 op) const
{
    u32 dst = addr;
    U32_INC(dst, 2);
    U32_INC(dst, S == Byte ? (i8)op : SEXT<S>(dasmIncRead<S>(addr)));

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            if (S == Byte && (u8)op == 0xFF) {

                dasmIllegal<I, M, S>(str, addr, op);
                break;
            }

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << Szb<S>{} << str.tab << UInt(dst);
            break;

        default:

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;
    }
}